

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify_to_core.cpp
# Opt level: O0

Literal * skiwi::anon_unknown_26::_make_true(void)

{
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  *in_RDI;
  undefined1 local_58 [8];
  True fa;
  Literal *lit;
  
  fa.filename.field_2._M_local_buf[0xf] = '\0';
  std::
  variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  ::variant((variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
             *)in_RDI);
  True::True((True *)local_58);
  local_58._0_4_ = -1;
  local_58._4_4_ = -1;
  std::
  variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>
  ::operator=(in_RDI,(True *)local_58);
  fa.filename.field_2._M_local_buf[0xf] = '\x01';
  True::~True((True *)local_58);
  if ((fa.filename.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~variant((variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                *)in_RDI);
  }
  return (Literal *)in_RDI;
}

Assistant:

Literal _make_true()
    {
    Literal lit;
    True fa;
    fa.line_nr = -1;
    fa.column_nr = -1;
    lit = fa;
    return lit;
    }